

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::
         StringMaker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
         ::convert(string *str)

{
  bool bVar1;
  uint uVar2;
  IContext *pIVar3;
  element_type *peVar4;
  reference pcVar5;
  undefined8 in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  string *s;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  char in_stack_ffffffffffffff67;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char in_stack_ffffffffffffff9f;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  undefined8 local_50;
  allocator local_46;
  undefined1 local_45;
  undefined8 local_38;
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __rhs = in_RDI;
  local_38 = in_RSI;
  pIVar3 = getCurrentContext();
  (*pIVar3->_vptr_IContext[4])();
  peVar4 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x247f95);
  uVar2 = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[10])();
  if ((uVar2 & 1) == 0) {
    std::operator+(in_stack_ffffffffffffff9f,__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   in_stack_ffffffffffffff67);
    std::__cxx11::string::~string(local_28);
  }
  else {
    local_45 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"\"",&local_46);
    std::allocator<char>::~allocator((allocator<char> *)&local_46);
    local_50 = local_38;
    local_58._M_current = (char *)std::__cxx11::string::begin();
    std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                              in_stack_ffffffffffffff58), bVar1) {
      pcVar5 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_58);
      if (*pcVar5 == '\t') {
        std::__cxx11::string::append((char *)in_RDI);
      }
      else if (*pcVar5 == '\n') {
        std::__cxx11::string::append((char *)in_RDI);
      }
      else {
        std::__cxx11::string::push_back((char)in_RDI);
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_58);
    }
    std::__cxx11::string::append((char *)in_RDI);
    local_45 = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return __rhs;
}

Assistant:

std::string StringMaker<std::string>::convert(const std::string& str) {
    if (!getCurrentContext().getConfig()->showInvisibles()) {
        return '"' + str + '"';
    }

    std::string s("\"");
    for (char c : str) {
        switch (c) {
        case '\n':
            s.append("\\n");
            break;
        case '\t':
            s.append("\\t");
            break;
        default:
            s.push_back(c);
            break;
        }
    }
    s.append("\"");
    return s;
}